

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

void flatbuffers::GenField<unsigned_char>
               (FieldDef *fd,Table *table,bool fixed,int indent_step,int indent,string *_text)

{
  uint uVar1;
  Table val;
  undefined7 in_register_00000011;
  
  uVar1 = (fd->value).offset;
  if ((int)CONCAT71(in_register_00000011,fixed) == 0) {
    val = (Table)Table::GetField<unsigned_char>(table,(voffset_t)uVar1,'\0');
  }
  else {
    val = table[uVar1];
  }
  Print<unsigned_char>((uchar)val,(fd->value).type,indent,indent_step,(StructDef *)0x0,_text);
  return;
}

Assistant:

static void GenField(const FieldDef &fd,
                                          const Table *table, bool fixed,
                                          int indent_step, int indent,
                                          std::string *_text) {
  Print(fixed ?
    reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset) :
    table->GetField<T>(fd.value.offset, 0), fd.value.type, indent, indent_step,
                       nullptr, _text);
}